

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsEntryPoint(AggressiveDCEPass *this,Function *func)

{
  Module *pMVar1;
  Instruction *this_00;
  uint32_t uVar2;
  uint32_t uVar3;
  Instruction **ppIVar4;
  Instruction *pIVar5;
  Instruction *entry_point;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar4 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  pIVar5 = (Instruction *)
           ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  do {
    this_00 = *ppIVar4;
    if (this_00 == pIVar5) break;
    uVar2 = Instruction::GetSingleWordInOperand(this_00,1);
    uVar3 = opt::Function::result_id(func);
    ppIVar4 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (uVar2 != uVar3);
  return this_00 != pIVar5;
}

Assistant:

bool AggressiveDCEPass::IsEntryPoint(Function* func) {
  for (const Instruction& entry_point : get_module()->entry_points()) {
    uint32_t entry_point_id =
        entry_point.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    if (entry_point_id == func->result_id()) {
      return true;
    }
  }
  return false;
}